

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
duckdb::NotImplementedException::NotImplementedException<duckdb::PhysicalType>
          (NotImplementedException *this,string *msg,PhysicalType params)

{
  string local_30;
  
  Exception::ConstructMessage<duckdb::PhysicalType>(&local_30,msg,params);
  NotImplementedException(this,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

explicit NotImplementedException(const string &msg, ARGS... params)
	    : NotImplementedException(ConstructMessage(msg, params...)) {
	}